

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O2

int __thiscall hwnet::Poller::Add(Poller *this,Ptr *channel,int flag)

{
  int iVar1;
  undefined8 in_RAX;
  iterator iVar2;
  __shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2> *this_00;
  int local_38;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  std::mutex::lock(&this->mtx);
  iVar1 = (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Channel[1])();
  _local_38 = CONCAT44(local_34,iVar1);
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->channels)._M_h,&local_38);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = Epoll::Add(&this->poller_,channel,flag);
    if (iVar1 == 0) {
      iVar1 = (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                _vptr_Channel[1])();
      _local_38 = CONCAT44(iVar1,local_38);
      this_00 = &std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->channels,&local_34)->
                 super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,&channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar1;
}

Assistant:

int Poller::Add(const Channel::Ptr &channel,int flag) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->channels.find(channel->Fd()) != this->channels.end()) {
		return -1;
	} else {
		int ret = poller_.Add(channel,flag);
		if(0 == ret) {
			this->channels[channel->Fd()] = channel;
		}
		return ret;
	}
}